

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O1

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<__int128>::Visit
          (PrecomputeVisitor<__int128> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  BinaryType BVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  __int128 *dest;
  __int128 *dest_00;
  __int128 result;
  __int128 rightValue;
  shared_ptr<const_calc4::Operator> right;
  shared_ptr<const_calc4::Operator> left;
  __int128 leftValue;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined1 local_69;
  shared_ptr<const_calc4::Operator> local_68;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  BinaryType local_38 [4];
  shared_ptr<const_calc4::Operator> local_28;
  
  peVar2 = (((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->left).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Operator)(peVar2,this);
  local_58._16_8_ =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_pi =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->right).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Operator)(peVar2,this);
  local_58._0_8_ =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58._8_8_ =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
    }
  }
  bVar3 = TryGetPrecomputedValue((PrecomputeVisitor<__int128> *)(local_58 + 0x10),&local_28,dest);
  if ((bVar3) &&
     (bVar3 = TryGetPrecomputedValue((PrecomputeVisitor<__int128> *)local_58,&local_68,dest_00),
     bVar3)) {
    BVar1 = ((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->type;
    if (BVar1 == Div) {
      if (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00121be4:
        (*(code *)(&DAT_00138020 + *(int *)(&DAT_00138020 + (ulong)BVar1 * 4)))
                  (local_28.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_28.
                          super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,&DAT_00138020,
                   local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi,
                   local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        return;
      }
    }
    else if ((BVar1 != Mod) ||
            (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
             local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             != (element_type *)0x0)) goto LAB_00121be4;
  }
  local_38[0] = ((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->type;
  std::
  __shared_ptr<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object>,std::shared_ptr<calc4::Operator_const>const&,std::shared_ptr<calc4::Operator_const>const&,calc4::BinaryType&>
            ((__shared_ptr<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object,(__gnu_cxx::_Lock_policy)2>
              *)&local_88,
             (allocator<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object> *)
             &local_69,(shared_ptr<const_calc4::Operator> *)(local_58 + 0x10),
             (shared_ptr<const_calc4::Operator> *)local_58,local_38);
  this_00 = (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_88;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_80;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        std::shared_ptr<const Operator> left = Precompute(op->GetLeft());
        std::shared_ptr<const Operator> right = Precompute(op->GetRight());

        TNumber leftValue, rightValue;
        if (TryGetPrecomputedValue(left, &leftValue) &&
            TryGetPrecomputedValue(right, &rightValue) &&
            !((op->GetType() == BinaryType::Div || op->GetType() == BinaryType::Mod) &&
              rightValue == 0))
        {
            TNumber result;

            switch (op->GetType())
            {
            case BinaryType::Add:
                result = leftValue + rightValue;
                break;
            case BinaryType::Sub:
                result = leftValue - rightValue;
                break;
            case BinaryType::Mult:
                result = leftValue * rightValue;
                break;
            case BinaryType::Div:
                result = leftValue / rightValue;
                break;
            case BinaryType::Mod:
                result = leftValue % rightValue;
                break;
            case BinaryType::Equal:
                result = (leftValue == rightValue) ? 1 : 0;
                break;
            case BinaryType::NotEqual:
                result = (leftValue != rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThan:
                result = (leftValue < rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThanOrEqual:
                result = (leftValue <= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThanOrEqual:
                result = (leftValue >= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThan:
                result = (leftValue > rightValue) ? 1 : 0;
                break;
            default:
                UNREACHABLE();
                break;
            }

            value = PrecomputedOperator::Create(result);
        }
        else
        {
            value = BinaryOperator::Create(left, right, op->GetType());
        }
    }